

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aTextureFilteringTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Accuracy::TextureFilteringTests::init(TextureFilteringTests *this,EVP_PKEY_CTX *ctx)

{
  TestNode *this_00;
  TestNode *node;
  Texture2DFilteringCase *this_01;
  long lVar1;
  TextureCubeFilteringCase *this_02;
  allocator<char> local_1e2;
  allocator<char> local_1e1;
  long local_1e0;
  TestNode *local_1d8;
  anon_struct_16_2_3f8b7511 *local_1d0;
  anon_struct_16_2_3f8b7511 *local_1c8;
  anon_struct_16_2_3f8b7511 *local_1c0;
  TestNode *local_1b8;
  long local_1b0;
  long local_1a8;
  long local_1a0;
  TestNode *local_198;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_1d8 = (TestNode *)operator_new(0x70);
  local_1b8 = (TestNode *)this;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_1d8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"2d",
             "2D Texture Filtering");
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,local_1b8->m_testCtx,"cube","Cube Map Filtering");
  this_00 = local_1b8;
  tcu::TestNode::addChild(local_1b8,local_1d8);
  tcu::TestNode::addChild(this_00,node);
  lVar1 = 0;
  local_198 = node;
  while (lVar1 != 6) {
    local_1d0 = init::minFilterModes + lVar1;
    local_1a0 = lVar1;
    for (local_1b0 = 0; local_1b0 != 2; local_1b0 = local_1b0 + 1) {
      local_1c8 = init::magFilterModes + local_1b0;
      for (local_1a8 = 0; local_1a8 != 3; local_1a8 = local_1a8 + 1) {
        local_1c0 = init::wrapModes + local_1a8;
        for (local_1e0 = 0; local_1e0 != 0x20; local_1e0 = local_1e0 + 0x10) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"",&local_1e1);
          std::operator+(&local_d0,&local_90,local_1d0->name);
          std::operator+(&local_150,&local_d0,"_");
          std::operator+(&local_130,&local_150,local_1c8->name);
          std::operator+(&local_110,&local_130,"_");
          std::operator+(&local_f0,&local_110,local_1c0->name);
          std::operator+(&local_70,&local_f0,"_");
          std::operator+(&local_170,&local_70,"rgba8");
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"_",&local_1e2);
          std::operator+(&local_50,&local_170,&local_b0);
          std::operator+(&name,&local_50,*(char **)((long)&init::sizes2D[0].name + local_1e0));
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::~string((string *)&local_130);
          std::__cxx11::string::~string((string *)&local_150);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_90);
          this_01 = (Texture2DFilteringCase *)operator_new(0x128);
          Texture2DFilteringCase::Texture2DFilteringCase
                    (this_01,local_1b8->m_testCtx,(RenderContext *)local_1b8[1]._vptr_TestNode[1],
                     (ContextInfo *)local_1b8[1]._vptr_TestNode[2],name._M_dataplus._M_p,"",
                     local_1d0->mode,local_1c8->mode,local_1c0->mode,local_1c0->mode,0x8058,
                     *(int *)((long)&init::sizes2D[0].width + local_1e0),
                     *(int *)((long)&init::sizes2D[0].height + local_1e0));
          tcu::TestNode::addChild(local_1d8,(TestNode *)this_01);
          std::__cxx11::string::~string((string *)&name);
        }
      }
    }
    lVar1 = local_1a0 + 1;
  }
  for (local_1b0 = 0; local_1b0 != 6; local_1b0 = local_1b0 + 1) {
    local_1d0 = init::minFilterModes + local_1b0;
    for (local_1d8 = (TestNode *)0x0; local_1d8 != (TestNode *)0x2;
        local_1d8 = (TestNode *)((long)local_1d8 + 1)) {
      local_1c8 = init::magFilterModes + (long)local_1d8;
      for (local_1a8 = 0; local_1a8 != 3; local_1a8 = local_1a8 + 1) {
        local_1c0 = init::wrapModes + local_1a8;
        local_1e0 = 0;
        while( true ) {
          if (local_1e0 == 0x20) break;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"",&local_1e1);
          std::operator+(&local_d0,&local_90,local_1d0->name);
          std::operator+(&local_150,&local_d0,"_");
          std::operator+(&local_130,&local_150,local_1c8->name);
          std::operator+(&local_110,&local_130,"_");
          std::operator+(&local_f0,&local_110,local_1c0->name);
          std::operator+(&local_70,&local_f0,"_");
          std::operator+(&local_170,&local_70,"rgba8");
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"_",&local_1e2);
          std::operator+(&local_50,&local_170,&local_b0);
          std::operator+(&name,&local_50,*(char **)((long)&init::sizesCube[0].name + local_1e0));
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::~string((string *)&local_130);
          std::__cxx11::string::~string((string *)&local_150);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_90);
          this_02 = (TextureCubeFilteringCase *)operator_new(0x128);
          TextureCubeFilteringCase::TextureCubeFilteringCase
                    (this_02,local_1b8->m_testCtx,(RenderContext *)local_1b8[1]._vptr_TestNode[1],
                     (ContextInfo *)local_1b8[1]._vptr_TestNode[2],name._M_dataplus._M_p,"",
                     local_1d0->mode,local_1c8->mode,local_1c0->mode,local_1c0->mode,false,0x8058,
                     *(int *)((long)&init::sizesCube[0].width + local_1e0),
                     *(int *)((long)&init::sizesCube[0].height + local_1e0));
          tcu::TestNode::addChild(local_198,(TestNode *)this_02);
          std::__cxx11::string::~string((string *)&name);
          local_1e0 = local_1e0 + 0x10;
        }
      }
    }
  }
  return 6;
}

Assistant:

void TextureFilteringTests::init (void)
{
	tcu::TestCaseGroup* group2D		= new tcu::TestCaseGroup(m_testCtx, "2d",	"2D Texture Filtering");
	tcu::TestCaseGroup*	groupCube	= new tcu::TestCaseGroup(m_testCtx, "cube",	"Cube Map Filtering");
	addChild(group2D);
	addChild(groupCube);

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} wrapModes[] =
	{
		{ "clamp",		GL_CLAMP_TO_EDGE },
		{ "repeat",		GL_REPEAT },
		{ "mirror",		GL_MIRRORED_REPEAT }
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} minFilterModes[] =
	{
		{ "nearest",				GL_NEAREST					},
		{ "linear",					GL_LINEAR					},
		{ "nearest_mipmap_nearest",	GL_NEAREST_MIPMAP_NEAREST	},
		{ "linear_mipmap_nearest",	GL_LINEAR_MIPMAP_NEAREST	},
		{ "nearest_mipmap_linear",	GL_NEAREST_MIPMAP_LINEAR	},
		{ "linear_mipmap_linear",	GL_LINEAR_MIPMAP_LINEAR		}
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} magFilterModes[] =
	{
		{ "nearest",	GL_NEAREST },
		{ "linear",		GL_LINEAR }
	};

	static const struct
	{
		const char*		name;
		int				width;
		int				height;
	} sizes2D[] =
	{
		{ "pot",		32, 64 },
		{ "npot",		31, 55 }
	};

	static const struct
	{
		const char*		name;
		int				width;
		int				height;
	} sizesCube[] =
	{
		{ "pot",		64, 64 },
		{ "npot",		63, 63 }
	};

	static const struct
	{
		const char*		name;
		deUint32		format;
	} formats[] =
	{
		{ "rgba8",		GL_RGBA8 }
	};

#define FOR_EACH(ITERATOR, ARRAY, BODY)	\
	for (int (ITERATOR) = 0; (ITERATOR) < DE_LENGTH_OF_ARRAY(ARRAY); (ITERATOR)++)	\
		BODY

	// 2D cases.
	FOR_EACH(minFilter,		minFilterModes,
	FOR_EACH(magFilter,		magFilterModes,
	FOR_EACH(wrapMode,		wrapModes,
	FOR_EACH(format,		formats,
	FOR_EACH(size,			sizes2D,
		{
			string name = string("") + minFilterModes[minFilter].name + "_" + magFilterModes[magFilter].name + "_" + wrapModes[wrapMode].name + "_" + formats[format].name + string("_") + sizes2D[size].name;

			group2D->addChild(new Texture2DFilteringCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
														 name.c_str(), "",
														 minFilterModes[minFilter].mode,
														 magFilterModes[magFilter].mode,
														 wrapModes[wrapMode].mode,
														 wrapModes[wrapMode].mode,
														 formats[format].format,
														 sizes2D[size].width, sizes2D[size].height));
		})))));

	// Cubemap cases.
	FOR_EACH(minFilter,		minFilterModes,
	FOR_EACH(magFilter,		magFilterModes,
	FOR_EACH(wrapMode,		wrapModes,
	FOR_EACH(format,		formats,
	FOR_EACH(size,			sizesCube,
		{
			string name = string("") + minFilterModes[minFilter].name + "_" + magFilterModes[magFilter].name + "_" + wrapModes[wrapMode].name + "_" + formats[format].name + string("_") + sizesCube[size].name;

			groupCube->addChild(new TextureCubeFilteringCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
															 name.c_str(), "",
															 minFilterModes[minFilter].mode,
															 magFilterModes[magFilter].mode,
															 wrapModes[wrapMode].mode,
															 wrapModes[wrapMode].mode,
															 false,
															 formats[format].format,
															 sizesCube[size].width, sizesCube[size].height));
		})))));
}